

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

int Cbs0_ManPropagate(Cbs0_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int k;
  int i;
  Gia_Obj_t *pVar;
  Cbs0_Man_t *p_local;
  
  do {
    local_24 = (p->pProp).iHead;
    while( true ) {
      bVar2 = false;
      if (local_24 < (p->pProp).iTail) {
        _k = (p->pProp).pData[local_24];
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Cbs0_ManPropagateOne(p,_k);
      if (iVar1 != 0) {
        return 1;
      }
      local_24 = local_24 + 1;
    }
    (p->pProp).iHead = (p->pProp).iTail;
    local_28 = (p->pJust).iHead;
    local_24 = (p->pJust).iHead;
    while( true ) {
      bVar2 = false;
      if (local_24 < (p->pJust).iTail) {
        _k = (p->pJust).pData[local_24];
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Cbs0_VarIsJust(_k);
      if (iVar1 == 0) {
        iVar1 = Cbs0_ManPropagateTwo(p,_k);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        (p->pJust).pData[local_28] = _k;
        local_28 = local_28 + 1;
      }
      local_24 = local_24 + 1;
    }
    if (local_28 == (p->pJust).iTail) {
      return 0;
    }
    (p->pJust).iTail = local_28;
  } while( true );
}

Assistant:

int Cbs0_ManPropagate( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar;
    int i, k;
    while ( 1 )
    {
        Cbs0_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( Cbs0_ManPropagateOne( p, pVar ) )
                return 1;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs0_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Cbs0_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( Cbs0_ManPropagateTwo( p, pVar ) )
                return 1;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}